

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeMemGrow(Mem *pMem,int n,int bPreserve)

{
  sqlite3 *psVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  
  uVar2 = 0x20;
  if (0x20 < n) {
    uVar2 = n;
  }
  bVar5 = bPreserve == 0;
  if (bVar5) {
    if (0 < pMem->szMalloc) goto LAB_00207e0e;
  }
  else if (0 < pMem->szMalloc) {
    if (pMem->z == pMem->zMalloc) {
      pcVar4 = (char *)sqlite3DbReallocOrFree(pMem->db,pMem->z,(ulong)uVar2);
      pMem->zMalloc = pcVar4;
      pMem->z = pcVar4;
      bVar5 = true;
      goto LAB_00207e3a;
    }
LAB_00207e0e:
    sqlite3DbFreeNN(pMem->db,pMem->zMalloc);
  }
  if (pMem->db == (sqlite3 *)0x0) {
    pcVar4 = (char *)sqlite3Malloc((ulong)uVar2);
  }
  else {
    pcVar4 = (char *)sqlite3DbMallocRawNN(pMem->db,(ulong)uVar2);
  }
  pMem->zMalloc = pcVar4;
LAB_00207e3a:
  if (pcVar4 == (char *)0x0) {
    if ((pMem->flags & 0x2460) == 0) {
      pMem->flags = 1;
    }
    else {
      vdbeMemClearExternAndSetNull(pMem);
    }
    pMem->z = (char *)0x0;
    pMem->szMalloc = 0;
    iVar3 = 7;
  }
  else {
    psVar1 = pMem->db;
    if (((psVar1 == (sqlite3 *)0x0) || (pcVar4 < (psVar1->lookaside).pStart)) ||
       ((psVar1->lookaside).pEnd <= pcVar4)) {
      uVar2 = (*sqlite3Config.m.xSize)(pcVar4);
    }
    else {
      uVar2 = (uint)(psVar1->lookaside).sz;
    }
    pMem->szMalloc = uVar2;
    if (((!bVar5) && (pcVar4 = pMem->z, pcVar4 != (char *)0x0)) && (pcVar4 != pMem->zMalloc)) {
      memcpy(pMem->zMalloc,pcVar4,(long)pMem->n);
    }
    uVar2._0_2_ = pMem->flags;
    uVar2._2_1_ = pMem->enc;
    uVar2._3_1_ = pMem->eSubtype;
    if ((uVar2 >> 10 & 1) != 0) {
      (*pMem->xDel)(pMem->z);
      uVar2._0_2_ = pMem->flags;
    }
    pMem->z = pMem->zMalloc;
    pMem->flags = (ushort)uVar2 & 0xe3ff;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int sqlite3VdbeMemGrow(Mem *pMem, int n, int bPreserve){
  assert( sqlite3VdbeCheckMemInvariants(pMem) );
  assert( (pMem->flags&MEM_RowSet)==0 );
  testcase( pMem->db==0 );

  /* If the bPreserve flag is set to true, then the memory cell must already
  ** contain a valid string or blob value.  */
  assert( bPreserve==0 || pMem->flags&(MEM_Blob|MEM_Str) );
  testcase( bPreserve && pMem->z==0 );

  assert( pMem->szMalloc==0
       || pMem->szMalloc==sqlite3DbMallocSize(pMem->db, pMem->zMalloc) );
  if( n<32 ) n = 32;
  if( bPreserve && pMem->szMalloc>0 && pMem->z==pMem->zMalloc ){
    pMem->z = pMem->zMalloc = sqlite3DbReallocOrFree(pMem->db, pMem->z, n);
    bPreserve = 0;
  }else{
    if( pMem->szMalloc>0 ) sqlite3DbFreeNN(pMem->db, pMem->zMalloc);
    pMem->zMalloc = sqlite3DbMallocRaw(pMem->db, n);
  }
  if( pMem->zMalloc==0 ){
    sqlite3VdbeMemSetNull(pMem);
    pMem->z = 0;
    pMem->szMalloc = 0;
    return SQLITE_NOMEM_BKPT;
  }else{
    pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->zMalloc);
  }

  if( bPreserve && pMem->z && ALWAYS(pMem->z!=pMem->zMalloc) ){
    memcpy(pMem->zMalloc, pMem->z, pMem->n);
  }
  if( (pMem->flags&MEM_Dyn)!=0 ){
    assert( pMem->xDel!=0 && pMem->xDel!=SQLITE_DYNAMIC );
    pMem->xDel((void *)(pMem->z));
  }

  pMem->z = pMem->zMalloc;
  pMem->flags &= ~(MEM_Dyn|MEM_Ephem|MEM_Static);
  return SQLITE_OK;
}